

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O0

ASN1_OBJECT * d2i_ASN1_OBJECT(ASN1_OBJECT **a,uchar **pp,long length)

{
  int iVar1;
  size_t length_00;
  ASN1_OBJECT *pAVar2;
  uint8_t *puVar3;
  ASN1_OBJECT *ret;
  uint8_t *contents;
  CBS child;
  CBS cbs;
  long len_local;
  uchar **inp_local;
  ASN1_OBJECT **out_local;
  
  if (length < 0) {
    out_local = (ASN1_OBJECT **)0x0;
  }
  else {
    CBS_init((CBS *)&child.len,*pp,length);
    iVar1 = CBS_get_asn1((CBS *)&child.len,(CBS *)&contents,6);
    if (iVar1 == 0) {
      ERR_put_error(0xc,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                    ,100);
      out_local = (ASN1_OBJECT **)0x0;
    }
    else {
      ret = (ASN1_OBJECT *)CBS_data((CBS *)&contents);
      length_00 = CBS_len((CBS *)&contents);
      out_local = (ASN1_OBJECT **)c2i_ASN1_OBJECT(a,(uchar **)&ret,length_00);
      if ((ASN1_OBJECT *)out_local != (ASN1_OBJECT *)0x0) {
        pAVar2 = (ASN1_OBJECT *)CBS_data((CBS *)&child.len);
        if (pAVar2 != ret) {
          __assert_fail("CBS_data(&cbs) == contents",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                        ,0x6c,
                        "ASN1_OBJECT *d2i_ASN1_OBJECT(ASN1_OBJECT **, const unsigned char **, long)"
                       );
        }
        puVar3 = CBS_data((CBS *)&child.len);
        *pp = puVar3;
      }
    }
  }
  return (ASN1_OBJECT *)out_local;
}

Assistant:

ASN1_OBJECT *d2i_ASN1_OBJECT(ASN1_OBJECT **out, const unsigned char **inp,
                             long len) {
  if (len < 0) {
    return NULL;
  }

  CBS cbs, child;
  CBS_init(&cbs, *inp, (size_t)len);
  if (!CBS_get_asn1(&cbs, &child, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return NULL;
  }

  const uint8_t *contents = CBS_data(&child);
  ASN1_OBJECT *ret = c2i_ASN1_OBJECT(out, &contents, CBS_len(&child));
  if (ret != NULL) {
    // |c2i_ASN1_OBJECT| should have consumed the entire input.
    assert(CBS_data(&cbs) == contents);
    *inp = CBS_data(&cbs);
  }
  return ret;
}